

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O1

void decompress_view(view_t *views,picnic_instance_t *pp,uint8_t *src,uint idx)

{
  ushort uVar1;
  sbyte sVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint64_t *f;
  byte *pbVar15;
  word *pwVar16;
  
  bVar6 = (pp->lowmc).m;
  uVar5 = (uint)(pp->lowmc).r;
  if ((ulong)bVar6 == 10) {
    if (uVar5 != 0) {
      bVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      do {
        uVar11 = (bVar6 & 3) * -2 - 0xe;
        uVar10 = (ulong)((bVar6 & 3) * 2) + 0x16;
        bVar3 = 8 - ((byte)uVar8 & 6);
        pbVar15 = src + (uVar8 >> 3) + 1;
        sVar2 = (bVar3 < 0x21) * (' ' - bVar3);
        uVar4 = (ulong)(((uint)pbVar15[-1] << sVar2) >> sVar2);
        do {
          uVar4 = (ulong)*pbVar15 | uVar4 << 8;
          pbVar15 = pbVar15 + 1;
          uVar11 = uVar11 + 8;
          uVar10 = uVar10 - 8;
        } while (7 < (uint)uVar10);
        if ((uint)uVar10 != 0) {
          sVar2 = ((byte)uVar10 < 0x21) * (' ' - (byte)uVar10);
          uVar4 = (ulong)(((uint)(*pbVar15 >> (uVar11 & 0x1f)) << sVar2) >> sVar2) |
                  uVar4 << (uVar10 & 0x3f);
        }
        uVar8 = uVar8 + 0x1e;
        views->t[idx] = uVar4 << 0x22;
        uVar7 = uVar7 + 1;
        views = views + 1;
        bVar6 = bVar6 + 3;
      } while (uVar7 != uVar5);
    }
  }
  else if (uVar5 != 0) {
    uVar8 = (ulong)bVar6 * 3;
    uVar1 = (pp->lowmc).n;
    uVar7 = 0;
    uVar4 = 0;
    do {
      pwVar16 = views->s[idx].w64 + ((ulong)(uVar1 + 0x3f >> 6) - 1);
      uVar10 = uVar8;
      if (0x15 < bVar6) {
        uVar11 = (uint)uVar4 & 7;
        do {
          pbVar15 = src + (uVar4 >> 3) + 1;
          uVar9 = (ulong)((uint)pbVar15[-1] & ~(-1 << ((byte)(8 - (char)uVar11) & 0x1f)));
          uVar14 = (ulong)uVar11 | 0x38;
          uVar12 = -uVar11 - 0x30;
          do {
            uVar9 = (ulong)*pbVar15 | uVar9 << 8;
            pbVar15 = pbVar15 + 1;
            uVar12 = uVar12 + 8;
            uVar14 = uVar14 - 8;
          } while (7 < (uint)uVar14);
          if ((uint)uVar14 != 0) {
            sVar2 = ((byte)uVar14 < 0x21) * (' ' - (byte)uVar14);
            uVar9 = (ulong)(((uint)(*pbVar15 >> (uVar12 & 0x1f)) << sVar2) >> sVar2) |
                    uVar9 << (uVar14 & 0x3f);
          }
          uVar4 = uVar4 + 0x40;
          *pwVar16 = uVar9;
          uVar10 = uVar10 - 0x40;
          pwVar16 = pwVar16 + -1;
        } while (0x3f < uVar10);
      }
      if (uVar10 == 0) goto LAB_0011afe4;
      uVar11 = 8 - ((uint)uVar4 & 7);
      sVar2 = ((byte)uVar11 < 0x21) * (' ' - (byte)uVar11);
      uVar13 = ((uint)src[uVar4 >> 3] << sVar2) >> sVar2;
      uVar14 = (ulong)uVar13;
      uVar12 = (uint)uVar10;
      if (uVar11 < uVar12) {
        pbVar15 = src + (uVar4 >> 3);
        uVar12 = uVar12 - uVar11;
        while( true ) {
          pbVar15 = pbVar15 + 1;
          if (uVar12 < 8) break;
          uVar14 = uVar14 << 8 | (ulong)*pbVar15;
          uVar12 = uVar12 - 8;
        }
        if (uVar12 != 0) {
          bVar3 = (byte)uVar12;
          sVar2 = (bVar3 < 0x21) * (' ' - bVar3);
          uVar14 = (ulong)(((uint)(*pbVar15 >> ((byte)(8 - bVar3) & 0x1f)) << sVar2) >> sVar2) |
                   uVar14 << ((ulong)uVar12 & 0x3f);
        }
      }
      else {
        uVar14 = (ulong)(uVar13 >> ((ulong)(uVar11 - uVar12) & 0x3f));
      }
      uVar4 = uVar4 + uVar10;
      *pwVar16 = uVar14 << ((ulong)(byte)-(char)uVar10 & 0x3f);
      while( true ) {
        pwVar16 = pwVar16 + -1;
LAB_0011afe4:
        if (pwVar16 < views->s + idx) break;
        *pwVar16 = 0;
      }
      uVar7 = uVar7 + 1;
      views = views + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

static void decompress_view(view_t* views, const picnic_instance_t* pp, const uint8_t* src,
                            const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.r = src;
  bs.position = 0;

  view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_from_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      v->t[idx] = uint64_from_bitstream_10(&bs);
    }
    return;
  }
#endif
  UNREACHABLE;
}